

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O0

void __thiscall PointPseudoLog0::test_method(PointPseudoLog0 *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_320;
  basic_cstring<const_char> local_310;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_300;
  double local_2e0;
  int local_2d4;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_2d0;
  assertion_result local_2a8;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  Matrix<double,__1,_1,_0,__1,_1> local_270;
  undefined1 local_260 [8];
  Vector3d res;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_240;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_218;
  Ref local_1f0 [8];
  Point y;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  undefined1 local_a0 [8];
  Vector3d v;
  RealSpace R3;
  PointPseudoLog0 *this_local;
  
  mnf::RealSpace::RealSpace
            ((RealSpace *)
             (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),3);
  local_a8 = 1.0;
  local_b0 = 2.0;
  local_b8 = 3.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_a0,&local_a8,&local_b0,&local_b8);
  res.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]._4_4_ =
       2;
  Eigen::operator*(&local_240,
                   (int *)((long)res.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array + 0x14),(StorageBaseType *)local_a0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_218,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_240,(type *)0x0);
  mnf::Manifold::createPoint(local_1f0);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_218);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_260);
  mnf::Point::pseudoLog0();
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)local_260,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_270);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_270);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_290);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_280,0x7b,&local_290);
    local_2d4 = 2;
    Eigen::operator*(&local_2d0,&local_2d4,(StorageBaseType *)local_a0);
    local_2e0 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::
            isApprox<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                      ((DenseBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_260,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_2d0,&local_2e0);
    boost::test_tools::assertion_result::assertion_result(&local_2a8,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_310,"res.isApprox(2 * v)",0x13);
    boost::unit_test::operator<<(&local_300,prev,&local_310);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_320,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    boost::test_tools::tt_detail::report_assertion(&local_2a8,&local_300,&local_320,0x7b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_300);
    boost::test_tools::assertion_result::~assertion_result(&local_2a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  mnf::Point::~Point((Point *)local_1f0);
  mnf::RealSpace::~RealSpace
            ((RealSpace *)
             (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointPseudoLog0)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);

  Point y = R3.createPoint(2 * v);
  Eigen::Vector3d res;

  res = y.pseudoLog0();
  BOOST_CHECK(res.isApprox(2 * v));
}